

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::output(FSM *this,string *var_name)

{
  shared_ptr<kratos::Var> local_28;
  string *local_18;
  string *var_name_local;
  FSM *this_local;
  
  local_18 = var_name;
  var_name_local = &this->fsm_name_;
  std::shared_ptr<kratos::Var>::shared_ptr(&local_28,(nullptr_t)0x0);
  output(this,var_name,&local_28);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_28);
  return;
}

Assistant:

void FSM::output(const std::string& var_name) { output(var_name, nullptr); }